

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile(DescriptorTable *table)

{
  GeneratedMessageFactory *this;
  DescriptorTable *table_local;
  
  this = anon_unknown_19::GeneratedMessageFactory::singleton();
  anon_unknown_19::GeneratedMessageFactory::RegisterFile(this,table);
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const google::protobuf::internal::DescriptorTable* table) {
  GeneratedMessageFactory::singleton()->RegisterFile(table);
}